

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Controller.cpp
# Opt level: O0

uint8_t __thiscall Controller::Read(Controller *this)

{
  uint8_t value;
  Controller *this_local;
  
  value = '\0';
  if ((this->index < 8) && ((this->buttons[this->index] & 1U) != 0)) {
    value = '\x01';
  }
  this->index = this->index + '\x01';
  if ((this->strobe & 1) != 0) {
    this->index = '\0';
  }
  return value;
}

Assistant:

uint8_t Controller::Read() {
    uint8_t value = 0;
    if (index < 8 && buttons[index]) {
        value = 1;
    }
    index++;
    if (strobe & 1) {
        index = 0;
    }
    return value;
}